

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void __thiscall CPropertyData::CPropertyData(CPropertyData *this,CPropertyData *src)

{
  CPropertyData *src_local;
  CPropertyData *this_local;
  
  ON_wString::ON_wString(&this->m_sName);
  ::ON_XMLVariant::ON_XMLVariant(&this->m_value);
  this->m_iRefCount = 1;
  std::recursive_mutex::recursive_mutex(&this->m_mutex);
  std::__atomic_base<long>::operator++(&g_lPropertyCount.super___atomic_base<long>,0);
  ON_wString::operator=(&this->m_sName,&src->m_sName);
  ::ON_XMLVariant::operator=(&this->m_value,&src->m_value);
  return;
}

Assistant:

CPropertyData(const CPropertyData& src) { g_lPropertyCount++; m_sName = src.m_sName; m_value = src.m_value; }